

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O3

QDBusArgument * operator>>(QDBusArgument *arg,QList<QDBusMenuLayoutItem> *list)

{
  char cVar1;
  long in_FS_OFFSET;
  undefined1 *local_60;
  QVariantMap local_58;
  QArrayDataPointer<QDBusMenuLayoutItem> QStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginArray();
  QList<QDBusMenuLayoutItem>::clear(list);
  cVar1 = QDBusArgument::atEnd();
  if (cVar1 == '\0') {
    do {
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      QStack_50.ptr = (QDBusMenuLayoutItem *)0x0;
      QStack_50.size = 0;
      local_58.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
            )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
              )0x0;
      QStack_50.d = (Data *)0x0;
      operator>>(arg,(QDBusMenuLayoutItem *)&local_60);
      QtPrivate::QMovableArrayOps<QDBusMenuLayoutItem>::emplace<QDBusMenuLayoutItem_const&>
                ((QMovableArrayOps<QDBusMenuLayoutItem> *)list,(list->d).size,
                 (QDBusMenuLayoutItem *)&local_60);
      QList<QDBusMenuLayoutItem>::end(list);
      QArrayDataPointer<QDBusMenuLayoutItem>::~QArrayDataPointer(&QStack_50);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&local_58.d);
      cVar1 = QDBusArgument::atEnd();
    } while (cVar1 == '\0');
  }
  QDBusArgument::endArray();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return arg;
  }
  __stack_chk_fail();
}

Assistant:

inline const QDBusArgument &operator>>(const QDBusArgument &arg, Container<T> &list)
{
    arg.beginArray();
    list.clear();
    while (!arg.atEnd()) {
        T item;
        arg >> item;
        list.push_back(item);
    }

    arg.endArray();
    return arg;
}